

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_info.cc
# Opt level: O2

void __thiscall pstack::Dwarf::Info::Info(Info *this,sptr *obj)

{
  _Rb_tree_header *p_Var1;
  Object *pOVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  Section *pSVar5;
  string local_48;
  allocator<char> local_21;
  
  (this->super_enable_shared_from_this<pstack::Dwarf::Info>)._M_weak_this.
  super___weak_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<pstack::Dwarf::Info>)._M_weak_this.
  super___weak_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->elf).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar3 = (obj->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var4 = (obj->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (obj->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->elf).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  (this->elf).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var4;
  (obj->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (this->callFrameForAddr)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->callFrameForAddr)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->callFrameForAddr)._M_t._M_impl.super__Rb_tree_header;
  (this->callFrameForAddr)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->callFrameForAddr)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->callFrameForAddr)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pOVar2 = (this->elf).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,".debug_info",&local_21);
  pSVar5 = Elf::Object::getDebugSection(pOVar2,&local_48,0);
  std::__cxx11::string::~string((string *)&local_48);
  this->debugInfo = pSVar5;
  pOVar2 = (this->elf).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,".debug_str",&local_21);
  pSVar5 = Elf::Object::getDebugSection(pOVar2,&local_48,0);
  std::__cxx11::string::~string((string *)&local_48);
  this->debugStrings = pSVar5;
  pOVar2 = (this->elf).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,".debug_line_str",&local_21);
  pSVar5 = Elf::Object::getDebugSection(pOVar2,&local_48,0);
  std::__cxx11::string::~string((string *)&local_48);
  this->debugLineStrings = pSVar5;
  pOVar2 = (this->elf).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,".debug_ranges",&local_21);
  pSVar5 = Elf::Object::getDebugSection(pOVar2,&local_48,0);
  std::__cxx11::string::~string((string *)&local_48);
  this->debugRanges = pSVar5;
  pOVar2 = (this->elf).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,".debug_str_offsets",&local_21);
  pSVar5 = Elf::Object::getDebugSection(pOVar2,&local_48,0);
  std::__cxx11::string::~string((string *)&local_48);
  this->debugStrOffsets = pSVar5;
  pOVar2 = (this->elf).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,".debug_addr",&local_21);
  pSVar5 = Elf::Object::getDebugSection(pOVar2,&local_48,0);
  std::__cxx11::string::~string((string *)&local_48);
  this->debugAddr = pSVar5;
  pOVar2 = (this->elf).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,".debug_rnglists",&local_21);
  pSVar5 = Elf::Object::getDebugSection(pOVar2,&local_48,0);
  std::__cxx11::string::~string((string *)&local_48);
  this->debugRangelists = pSVar5;
  (this->pubnameUnits)._M_t.
  super___uniq_ptr_impl<std::__cxx11::list<pstack::Dwarf::PubnameUnit,_std::allocator<pstack::Dwarf::PubnameUnit>_>,_std::default_delete<std::__cxx11::list<pstack::Dwarf::PubnameUnit,_std::allocator<pstack::Dwarf::PubnameUnit>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::list<pstack::Dwarf::PubnameUnit,_std::allocator<pstack::Dwarf::PubnameUnit>_>_*,_std::default_delete<std::__cxx11::list<pstack::Dwarf::PubnameUnit,_std::allocator<pstack::Dwarf::PubnameUnit>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::list<pstack::Dwarf::PubnameUnit,_std::allocator<pstack::Dwarf::PubnameUnit>_>_*,_false>
  ._M_head_impl =
       (list<pstack::Dwarf::PubnameUnit,_std::allocator<pstack::Dwarf::PubnameUnit>_> *)0x0;
  p_Var1 = &(this->units)._M_t._M_impl.super__Rb_tree_header;
  (this->units)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->units)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->units)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->units)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->cfi)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->cfi)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->cfi)._M_t._M_impl.super__Rb_tree_header;
  (this->units)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->altDwarf).super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->altDwarf).super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->aranges)._M_t.
  super___uniq_ptr_impl<std::map<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::default_delete<std::map<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::map<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>_*,_std::default_delete<std::map<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
  .
  super__Head_base<0UL,_std::map<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>_*,_false>
  ._M_head_impl =
       (map<unsigned_long,_std::pair<unsigned_long,_unsigned_long>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_long,_unsigned_long>_>_>_>
        *)0x0;
  (this->macros)._M_t.
  super___uniq_ptr_impl<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>._M_t.
  super__Tuple_impl<0UL,_pstack::Dwarf::Macros_*,_std::default_delete<pstack::Dwarf::Macros>_>.
  super__Head_base<0UL,_pstack::Dwarf::Macros_*,_false>._M_head_impl = (Macros *)0x0;
  (this->cfi)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->cfi)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->cfi)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->altImageLoaded = false;
  this->unitRangesCached = false;
  return;
}

Assistant:

Info::Info(Elf::Object::sptr obj)
    : elf(std::move(obj))
    , debugInfo(elf->getDebugSection(".debug_info", SHT_NULL))
    , debugStrings(elf->getDebugSection(".debug_str", SHT_NULL))
    , debugLineStrings(elf->getDebugSection(".debug_line_str", SHT_NULL))
    , debugRanges(elf->getDebugSection(".debug_ranges", SHT_NULL))
    , debugStrOffsets(elf->getDebugSection(".debug_str_offsets", SHT_NULL))
    , debugAddr(elf->getDebugSection(".debug_addr", SHT_NULL))
    , debugRangelists(elf->getDebugSection(".debug_rnglists", SHT_NULL))
{
}